

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

int conn_is_conn(Curl_easy *data,connectdata *conn,void *param)

{
  bool bVar1;
  
  bVar1 = conn->connection_id == *param;
  if (bVar1) {
    *(connectdata **)((long)param + 8) = conn;
  }
  return (uint)bVar1;
}

Assistant:

static int conn_is_conn(struct Curl_easy *data,
                        struct connectdata *conn, void *param)
{
  struct connfind *f = (struct connfind *)param;
  (void)data;
  if(conn->connection_id == f->id_tofind) {
    f->found = conn;
    return 1;
  }
  return 0;
}